

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_Encode(CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
                   ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  ISeqOutStream *in_RCX;
  CLzmaEncHandle in_RDX;
  ISeqInStream *in_R8;
  ISzAlloc *in_R9;
  int __result__;
  ICompressProgress *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  local_4 = LzmaEnc_Prepare(in_RDX,in_RCX,in_R8,in_R9,
                            (ISzAlloc *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (local_4 == 0) {
    local_4 = LzmaEnc_Encode2((CLzmaEnc *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                             );
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream *outStream, ISeqInStream *inStream, ICompressProgress *progress,
    ISzAlloc *alloc, ISzAlloc *allocBig)
{
  RINOK(LzmaEnc_Prepare(pp, outStream, inStream, alloc, allocBig));
  return LzmaEnc_Encode2((CLzmaEnc *)pp, progress);
}